

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.h
# Opt level: O2

void __thiscall Memory::MarkContext::Cleanup(MarkContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PagePool *this_00;
  
  bVar2 = HasPendingObjects(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                       ,0x67,"(!HasPendingObjects())","!HasPendingObjects()");
    if (!bVar2) goto LAB_0068c021;
    *puVar3 = 0;
  }
  this_00 = this->pagePool;
  if ((this_00->pageAllocator).disableAllocationOutOfMemory == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                       ,0x68,"(!GetPageAllocator()->DisableAllocationOutOfMemory())",
                       "!GetPageAllocator()->DisableAllocationOutOfMemory()");
    if (!bVar2) {
LAB_0068c021:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = this->pagePool;
  }
  PagePool::ReleaseFreePages(this_00);
  return;
}

Assistant:

void Cleanup()
    {
        Assert(!HasPendingObjects());
        Assert(!GetPageAllocator()->DisableAllocationOutOfMemory());
        this->pagePool->ReleaseFreePages();
    }